

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O0

void olsrv2_routing_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  list_entity **pplStack_50;
  int i;
  olsrv2_routing_filter *f_it;
  olsrv2_routing_filter *filter;
  olsrv2_routing_entry *e_it;
  olsrv2_routing_entry *entry;
  
  nhdp_domain_listener_remove(&_nhdp_listener);
  oonf_timer_stop(&_rate_limit_timer);
  for (__tempptr._4_4_ = 0; __tempptr._4_4_ < 4; __tempptr._4_4_ = __tempptr._4_4_ + 1) {
    plVar1 = _routing_tree[__tempptr._4_4_].list_head.next;
    e_it = (olsrv2_routing_entry *)&plVar1[-0x17].prev;
    plVar1 = plVar1->next;
    while( true ) {
      filter = (olsrv2_routing_filter *)&plVar1[-0x17].prev;
      if ((e_it->_node).list.prev == _routing_tree[__tempptr._4_4_].list_head.prev) break;
      _remove_entry(e_it);
      e_it = (olsrv2_routing_entry *)filter;
      plVar1 = plVar1->next;
    }
  }
  f_it = (olsrv2_routing_filter *)&_routing_filter_list.next[-1].prev;
  plVar1 = (_routing_filter_list.next)->next;
  while( true ) {
    pplStack_50 = &plVar1[-1].prev;
    if ((f_it->_node).prev == _routing_filter_list.prev) break;
    plVar2 = (f_it->_node).prev;
    plVar3 = (f_it->_node).next;
    plVar2->next = plVar3;
    plVar3->prev = plVar2;
    (f_it->_node).prev = (list_entity *)0x0;
    (f_it->_node).next = (list_entity *)0x0;
    f_it = (olsrv2_routing_filter *)pplStack_50;
    plVar1 = plVar1->next;
  }
  oonf_timer_remove(&_dijkstra_timer_info);
  oonf_class_remove(&_rtset_entry);
  return;
}

Assistant:

void
olsrv2_routing_cleanup(void) {
  struct olsrv2_routing_entry *entry, *e_it;
  struct olsrv2_routing_filter *filter, *f_it;
  int i;

  nhdp_domain_listener_remove(&_nhdp_listener);
  oonf_timer_stop(&_rate_limit_timer);

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    avl_for_each_element_safe(&_routing_tree[i], entry, _node, e_it) {
      /* remove entry from database */
      _remove_entry(entry);
    }
  }

  list_for_each_element_safe(&_routing_filter_list, filter, _node, f_it) {
    olsrv2_routing_filter_remove(filter);
  }

  oonf_timer_remove(&_dijkstra_timer_info);
  oonf_class_remove(&_rtset_entry);
}